

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

void __thiscall TypeChecker::visit(TypeChecker *this,BinaryOpNode *node)

{
  bool bVar1;
  undefined1 uVar2;
  __optional_ne_t<TypeName,_TypeName> _Var3;
  undefined1 uVar4;
  ExpressionNode *pEVar5;
  BinaryOperator *pBVar6;
  unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  BinaryOpNode *in_RSI;
  long in_RDI;
  Node *in_stack_00000058;
  string *in_stack_00000060;
  optional<TypeName> rightType;
  optional<TypeName> leftType;
  TypeChecker checker;
  SymbolTable *in_stack_fffffffffffffe58;
  TypeChecker *in_stack_fffffffffffffe60;
  undefined5 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6d;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffe6f;
  __optional_ne_t<TypeName,_TypeName> local_17a;
  undefined7 in_stack_fffffffffffffea0;
  undefined8 local_fc;
  undefined8 local_e8;
  undefined8 local_50;
  TypeChecker local_28;
  BinaryOpNode *local_10;
  
  local_10 = in_RSI;
  TypeChecker(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  pEVar5 = BinaryOpNode::getLeftOperand((BinaryOpNode *)0x177fe2);
  (*(pEVar5->super_Node)._vptr_Node[2])(pEVar5,&local_28);
  getType(&local_28);
  pEVar5 = BinaryOpNode::getRightOperand((BinaryOpNode *)0x178026);
  (*(pEVar5->super_Node)._vptr_Node[2])(pEVar5,&local_28);
  getType(&local_28);
  bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x17806a);
  if ((bVar1) && (bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x17807d), bVar1)
     ) {
    uVar2 = std::operator==((optional<TypeName> *)in_stack_fffffffffffffe60,
                            (TypeName *)in_stack_fffffffffffffe58);
    if ((bool)uVar2) {
      pBVar6 = BinaryOpNode::getOperation(local_10);
      if (*pBVar6 != Addition) {
        std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffe60);
        std::
        unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe60,(key_type *)in_stack_fffffffffffffe58);
        std::operator+((char *)pEVar5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,in_stack_fffffffffffffea0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,
                                         CONCAT15(in_stack_fffffffffffffe6d,
                                                  in_stack_fffffffffffffe68))),
                       (char *)in_stack_fffffffffffffe60);
        reportError(in_stack_00000060,in_stack_00000058);
      }
      _Var3 = std::operator!=((optional<TypeName> *)in_stack_fffffffffffffe60,
                              (TypeName *)in_stack_fffffffffffffe58);
      local_17a = false;
      if (_Var3) {
        local_17a = std::operator!=((optional<TypeName> *)in_stack_fffffffffffffe60,
                                    (TypeName *)in_stack_fffffffffffffe58);
      }
      if (local_17a != false) {
        std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffe60);
        std::
        unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe60,(key_type *)in_stack_fffffffffffffe58);
        std::operator+((char *)pEVar5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,in_stack_fffffffffffffea0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,
                                         CONCAT15(in_stack_fffffffffffffe6d,
                                                  in_stack_fffffffffffffe68))),
                       (char *)in_stack_fffffffffffffe60);
        reportError(in_stack_00000060,in_stack_00000058);
      }
      std::optional<TypeName>::optional<TypeName,_true>
                ((optional<TypeName> *)in_stack_fffffffffffffe60,
                 (TypeName *)in_stack_fffffffffffffe58);
      *(undefined8 *)(in_RDI + 8) = local_e8;
    }
    else {
      uVar4 = std::operator==((optional<TypeName> *)in_stack_fffffffffffffe60,
                              (TypeName *)in_stack_fffffffffffffe58);
      uVar7 = false;
      if ((bool)uVar4) {
        in_stack_fffffffffffffe6d =
             std::operator==((optional<TypeName> *)in_stack_fffffffffffffe60,
                             (TypeName *)in_stack_fffffffffffffe58);
        uVar7 = in_stack_fffffffffffffe6d;
      }
      if ((__optional_eq_t<TypeName,_TypeName>)uVar7 == false) {
        this_00 = (unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffe60)
        ;
        std::
        unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at(this_00,(key_type *)in_stack_fffffffffffffe58);
        std::operator+((char *)pEVar5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,in_stack_fffffffffffffea0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar4,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffffe6d,
                                                              in_stack_fffffffffffffe68))),
                       (char *)this_00);
        reportError(in_stack_00000060,in_stack_00000058);
      }
      std::optional<TypeName>::optional<TypeName,_true>
                ((optional<TypeName> *)in_stack_fffffffffffffe60,
                 (TypeName *)in_stack_fffffffffffffe58);
      *(undefined8 *)(in_RDI + 8) = local_fc;
    }
  }
  else {
    std::optional<TypeName>::optional((optional<TypeName> *)0x17808e);
    *(undefined8 *)(in_RDI + 8) = local_50;
  }
  ~TypeChecker((TypeChecker *)0x1784b7);
  return;
}

Assistant:

void TypeChecker::visit(const BinaryOpNode& node)
{
  TypeChecker checker{symbols_};
  node.getLeftOperand().accept(checker);  
  auto leftType = checker.getType();

  node.getRightOperand().accept(checker);
  auto rightType = checker.getType();

  if(!leftType.has_value() || !rightType.has_value())
    type_ = {};
  else if(leftType == TypeName::String)
  {
    if(node.getOperation() != BinaryOperator::Addition)
      reportError("Invalid operation on value of type " + 
        TypeNameStrings.at(leftType.value()) + "!", node);
    else if(rightType != TypeName::F32 && rightType != TypeName::String)
      reportError("Cannot concatenate string with " +
        TypeNameStrings.at(rightType.value()) + "!", node);

    type_ = TypeName::String;
  }
  else if(leftType == TypeName::F32 && rightType == TypeName::F32)
    type_ = TypeName::F32;
  else
    reportError("Invalid operation on value of type " + 
        TypeNameStrings.at(leftType.value()) + "!", node);
}